

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

void unistrTextCopy(UText *ut,int64_t start,int64_t limit,int64_t destIndex,UBool move,
                   UErrorCode *pErrorCode)

{
  short sVar1;
  UnicodeString *this;
  int32_t iVar2;
  char16_t *pcVar3;
  long lVar4;
  int32_t segLength;
  int iVar5;
  ulong uVar6;
  char *__filename;
  int iVar7;
  uint uVar8;
  char *pcVar9;
  uint uVar10;
  ulong uVar11;
  
  if (U_ZERO_ERROR < *pErrorCode) {
    return;
  }
  this = (UnicodeString *)ut->context;
  sVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar2 = (this->fUnion).fFields.fLength;
  }
  else {
    iVar2 = (int)sVar1 >> 5;
  }
  uVar11 = (ulong)iVar2;
  uVar6 = start;
  if ((long)uVar11 < start) {
    uVar6 = uVar11;
  }
  __filename = (char *)(uVar6 & 0xffffffff);
  if (start < 0) {
    __filename = (char *)0x0;
  }
  iVar5 = (int)__filename;
  uVar6 = limit;
  if ((long)uVar11 < limit) {
    uVar6 = uVar11;
  }
  pcVar9 = (char *)(uVar6 & 0xffffffff);
  if (limit < 0) {
    pcVar9 = (char *)0x0;
  }
  if (destIndex <= (long)uVar11) {
    uVar11 = destIndex;
  }
  uVar10 = (uint)uVar11;
  if (destIndex < 0) {
    uVar10 = 0;
  }
  iVar7 = (int)pcVar9;
  if ((iVar7 < iVar5) || ((iVar5 < (int)uVar10 && ((int)uVar10 < iVar7)))) {
    *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
  }
  else {
    if (move == '\0') {
      (*(this->super_Replaceable).super_UObject._vptr_UObject[5])
                (this,__filename,pcVar9,(ulong)uVar10);
    }
    else {
      (*(this->super_Replaceable).super_UObject._vptr_UObject[5])
                (this,__filename,pcVar9,(ulong)uVar10);
      if ((int)uVar10 < iVar5) {
        __filename = pcVar9;
      }
      iVar5 = (int)__filename;
      icu_63::UnicodeString::remove(this,__filename);
    }
    pcVar3 = icu_63::UnicodeString::getBuffer(this);
    ut->chunkContents = pcVar3;
    if (move == '\0') {
      lVar4 = (long)(iVar7 - iVar5) + (long)ut->chunkLength;
      iVar2 = (int32_t)lVar4;
      ut->chunkLength = iVar2;
      ut->chunkNativeLimit = lVar4;
      ut->nativeIndexingLimit = iVar2;
    }
    uVar8 = (iVar7 + uVar10) - iVar5;
    if ((int)uVar10 <= iVar5) {
      uVar10 = uVar8;
    }
    if (move == '\0') {
      uVar10 = uVar8;
    }
    ut->chunkOffset = uVar10;
  }
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }